

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

void eraseAllTableMapElements<std::unordered_map<XrMarkerDetectorML_T*,XrGeneratedDispatchTable*,std::hash<XrMarkerDetectorML_T*>,std::equal_to<XrMarkerDetectorML_T*>,std::allocator<std::pair<XrMarkerDetectorML_T*const,XrGeneratedDispatchTable*>>>>
               (unordered_map<XrMarkerDetectorML_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrMarkerDetectorML_T_*>,_std::equal_to<XrMarkerDetectorML_T_*>,_std::allocator<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>_>_>
                *search_map,mutex *mutex,XrGeneratedDispatchTable *search_value)

{
  _Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
  _Var1;
  const_iterator __it;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = mutex;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  _Var1._M_cur = (__node_type *)(search_map->_M_h)._M_before_begin._M_nxt;
  while (__it.
         super__Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
         ._M_cur = (_Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
                    )(_Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
                      )_Var1._M_cur,
        __it.
        super__Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
        ._M_cur != (__node_type *)0x0) {
    _Var1._M_cur = *(__node_type **)
                    __it.
                    super__Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
                    ._M_cur;
    if (*(XrGeneratedDispatchTable **)
         ((long)__it.
                super__Node_iterator_base<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_false>
                ._M_cur + 0x10) == search_value) {
      std::
      _Hashtable<XrMarkerDetectorML_T_*,_std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrMarkerDetectorML_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrMarkerDetectorML_T_*>,_std::hash<XrMarkerDetectorML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&search_map->_M_h,__it);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void eraseAllTableMapElements(MapType &search_map, std::mutex &mutex, XrGeneratedDispatchTable *search_value) {
    std::unique_lock<std::mutex> lock(mutex);
    for (auto it = search_map.begin(); it != search_map.end();) {
        if (it->second == search_value) {
            search_map.erase(it++);
        } else {
            ++it;
        }
    }
}